

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc4.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s;
  char *filename;
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> in_data;
  ostream *poVar4;
  uchar *key_data;
  FILE *__stream;
  size_t sVar5;
  long lVar6;
  FILE *pFVar7;
  Pl_StdioFile *this;
  Pl_RC4 *this_00;
  void *__buf;
  uchar *in_RCX;
  uchar *in_R8;
  uint keylen;
  undefined4 uStack_a4;
  FILE *local_a0;
  uchar buf [100];
  
  if (argc == 4) {
    __s = argv[1];
    filename = argv[2];
    local_a0 = (FILE *)argv[3];
    buf._0_8_ = strlen(__s);
    uVar3 = QIntC::IntConverter<unsigned_long,_unsigned_int,_false,_false>::convert
                      ((unsigned_long *)buf);
    uVar3 = uVar3 >> 1;
    keylen = uVar3;
    key_data = (uchar *)operator_new__((ulong)(uVar3 + 1));
    key_data[uVar3] = '\0';
    __stream = (FILE *)QUtil::safe_fopen(filename,"rb");
    uVar3 = 0;
    while( true ) {
      sVar5 = strlen(__s);
      uVar1 = buf._0_8_;
      if (sVar5 <= uVar3) break;
      buf[1] = __s[uVar3 + 1];
      buf[0] = __s[uVar3];
      buf._3_5_ = SUB85(uVar1,3);
      buf[2] = '\0';
      lVar6 = strtol((char *)buf,(char **)0x0,0x10);
      key_data[uVar3 >> 1] = (uchar)lVar6;
      uVar3 = uVar3 + 2;
    }
    pFVar7 = (FILE *)QUtil::safe_fopen((char *)local_a0,"wb");
    this = (Pl_StdioFile *)operator_new(0x38);
    Pl_StdioFile::Pl_StdioFile(this,"stdout",(FILE *)pFVar7);
    local_a0 = pFVar7;
    this_00 = (Pl_RC4 *)operator_new(0x58);
    iVar2 = QIntC::IntConverter<unsigned_int,_int,_false,_true>::convert(&keylen);
    Pl_RC4::Pl_RC4(this_00,"rc4",(Pipeline *)this,key_data,iVar2,0x40);
    operator_delete__(key_data);
    while (pFVar7 = __stream, __buf = (void *)fread(buf,1,100,__stream), __buf != (void *)0x0) {
      Pl_RC4::write(this_00,(int)buf,__buf,(size_t)pFVar7);
    }
    Pl_RC4::finish(this_00);
    Pl_RC4::~Pl_RC4(this_00);
    operator_delete(this_00,0x58);
    (*(this->super_Pipeline)._vptr_Pipeline[1])(this);
    fclose(__stream);
    fclose(local_a0);
    return 0;
  }
  if ((argc == 2) && (iVar2 = strcmp(argv[1],"other"), iVar2 == 0)) {
    RC4::RC4((RC4 *)buf,(RC4_KEY *)"quack",0xffffffffffffffff,in_RCX,in_R8);
    in_data.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)operator_new__(6);
    ((uchar *)
    ((long)in_data.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 4))[0] = 't';
    ((uchar *)
    ((long)in_data.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 4))[1] = 'o';
    *(undefined4 *)
     in_data.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = 0x61746f70;
    _keylen = (uchar *)in_data.
                       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                       .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    RC4::process((RC4 *)buf,
                 (uchar *)in_data.
                          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                          .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,6,
                 (uchar *)in_data.
                          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                          .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
    iVar2 = bcmp((void *)in_data.
                         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                         .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                 anon_var_dwarf_2ffd,6);
    if (iVar2 == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"passed");
      std::endl<char,std::char_traits<char>>(poVar4);
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&keylen);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(buf + 8));
      return 0;
    }
    __assert_fail("memcmp(data.get(), \"\\xa5\\x6f\\xe7\\x27\\x2b\\x5c\", 6) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/rc4.cc"
                  ,0x16,"void other_tests()");
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"Usage: rc4 hex-key infile outfile");
  std::endl<char,std::char_traits<char>>(poVar4);
  exit(2);
}

Assistant:

int
main(int argc, char* argv[])
{
    if ((argc == 2) && (strcmp(argv[1], "other") == 0)) {
        other_tests();
        return 0;
    }

    if (argc != 4) {
        std::cerr << "Usage: rc4 hex-key infile outfile" << std::endl;
        exit(2);
    }

    char* hexkey = argv[1];
    char* infilename = argv[2];
    char* outfilename = argv[3];
    unsigned int hexkeylen = QIntC::to_uint(strlen(hexkey));
    unsigned int keylen = hexkeylen / 2;
    auto* key = new unsigned char[keylen + 1];
    key[keylen] = '\0';

    FILE* infile = QUtil::safe_fopen(infilename, "rb");
    for (unsigned int i = 0; i < strlen(hexkey); i += 2) {
        char t[3];
        t[0] = hexkey[i];
        t[1] = hexkey[i + 1];
        t[2] = '\0';

        long val = strtol(t, nullptr, 16);
        key[i / 2] = static_cast<unsigned char>(val);
    }

    FILE* outfile = QUtil::safe_fopen(outfilename, "wb");
    auto* out = new Pl_StdioFile("stdout", outfile);
    // Use a small buffer size (64) for testing
    auto* rc4 = new Pl_RC4("rc4", out, key, QIntC::to_int(keylen), 64U);
    delete[] key;

    // 64 < buffer size < 512, buffer_size is not a power of 2 for testing
    unsigned char buf[100];
    bool done = false;
    while (!done) {
        size_t len = fread(buf, 1, sizeof(buf), infile);
        if (len <= 0) {
            done = true;
        } else {
            rc4->write(buf, len);
        }
    }
    rc4->finish();
    delete rc4;
    delete out;
    fclose(infile);
    fclose(outfile);
    return 0;
}